

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

expr_node * __thiscall expr_tree::derivative(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_value local_20;
  
  if (node->type == '\x03') {
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,1);
    expr_node::expr_node(peVar1,'\x01',&local_20,(expr_node *)0x0,(expr_node *)0x0,(expr_node *)0x0)
    ;
    return peVar1;
  }
  if (node->type != '\x05') {
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,0);
    expr_node::expr_node(peVar1,'\x01',&local_20,(expr_node *)0x0,(expr_node *)0x0,(expr_node *)0x0)
    ;
    return peVar1;
  }
  switch((node->value).integer) {
  case 1:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,1);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = node->left;
LAB_00107ee7:
    peVar2 = derivative(this,peVar2);
    goto LAB_00107eef;
  case 2:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,2);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = node->left;
    if (peVar2 != (expr_node *)0x0) goto LAB_00107ee7;
    peVar2 = (expr_node *)0x0;
LAB_00107eef:
    peVar1->left = peVar2;
    peVar2 = derivative(this,node->right);
    break;
  case 3:
    peVar1 = mulDeriv(this,node);
    return peVar1;
  case 4:
    peVar1 = divDeriv(this,node);
    return peVar1;
  case 5:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->left);
    peVar1->left = peVar2;
    peVar2 = pwrDeriv(this,node);
    break;
  case 6:
    peVar1 = expDeriv(this,node);
    return peVar1;
  case 7:
    peVar1 = logDeriv(this,node);
    return peVar1;
  case 8:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = sqrtDeriv(this,node);
    break;
  case 9:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = sinDeriv(this,node);
    break;
  case 10:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = cosDeriv(this,node);
    break;
  case 0xb:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = tanDeriv(this,node);
    break;
  case 0xc:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = cotDeriv(this,node);
    break;
  case 0xd:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = arcsinDeriv(this,node);
    break;
  case 0xe:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = arccosDeriv(this,node);
    break;
  case 0xf:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = arctanDeriv(this,node);
    break;
  case 0x10:
    peVar1 = (expr_node *)operator_new(0x28);
    expr_value::expr_value(&local_20,3);
    expr_node::expr_node(peVar1,'\x05',&local_20);
    peVar2 = derivative(this,node->right);
    peVar1->left = peVar2;
    peVar2 = arccotDeriv(this,node);
    break;
  default:
    return (expr_node *)0x0;
  }
  peVar1->right = peVar2;
  Link(peVar1,peVar1->left,peVar2);
  return peVar1;
}

Assistant:

expr_node* expr_tree::derivative(const expr_node* node)
{
    expr_node* deriv = nullptr;
    if (node->type == OP) {
        switch (node->value.integer) {
        case ADD:
            deriv = new expr_node(OP, (long)ADD);
            deriv->left = derivative(node->left);
            deriv->right = derivative(node->right);
            Link(deriv, deriv->left, deriv->right);
            break;
        case SUB:
            deriv = new expr_node(OP, (long)SUB);
            if (node->left != nullptr) // bc minus can be unary
                deriv->left = derivative(node->left);
            else
                deriv->left = nullptr;
            deriv->right = derivative(node->right);
            Link(deriv, deriv->left, deriv->right);
            break;
        case MUL:
            deriv = mulDeriv(node);
            break;
        case DIV:
            deriv = divDeriv(node);
            break;
        case SQRT:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = sqrtDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case EXP:
            deriv = expDeriv(node);
            break;
        case LOG:
            deriv = logDeriv(node);
            break;
        case PWR:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->left);
            deriv->right = pwrDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case SIN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = sinDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case COS:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = cosDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case TAN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = tanDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case COT:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = cotDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ASIN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arcsinDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ACOS:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arccosDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ATAN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arctanDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ACOT:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arccotDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        default:
            break;
        }
    } else if (node->type == VAR) {
        deriv = new expr_node(INT, (long)1, nullptr, nullptr, nullptr);
    } else {
        deriv = new expr_node(INT, (long)0, nullptr, nullptr, nullptr);
    }
    return deriv;
}